

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Exp_PrintNodeVerilog(FILE *pFile,int nVars,Vec_Int_t *p,Vec_Ptr_t *vNames,int Node,int fCompl)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  
  if (-1 < Node) {
    uVar1 = Node * 2 + 1;
    iVar4 = p->nSize;
    if ((int)uVar1 < iVar4) {
      iVar2 = nVars * 2;
      if (SBORROW4(p->pArray[uVar1],iVar2) == p->pArray[uVar1] + nVars * -2 < 0) {
        fputc(0x28,(FILE *)pFile);
        iVar4 = p->nSize;
      }
      if ((int)uVar1 < iVar4) {
        Exp_PrintLitVerilog(pFile,nVars,p,vNames,p->pArray[uVar1] ^ fCompl);
        if ((int)uVar1 < p->nSize) {
          uVar3 = Node * 2;
          if (iVar2 <= p->pArray[uVar1]) {
            fputc(0x29,(FILE *)pFile);
          }
          uVar5 = 0x7c;
          if (fCompl == 0) {
            uVar5 = 0x26;
          }
          fprintf((FILE *)pFile," %c ",uVar5);
          iVar4 = p->nSize;
          if ((int)uVar3 < iVar4) {
            if (iVar2 <= p->pArray[uVar3]) {
              fputc(0x28,(FILE *)pFile);
              iVar4 = p->nSize;
            }
            if ((int)uVar3 < iVar4) {
              Exp_PrintLitVerilog(pFile,nVars,p,vNames,fCompl ^ p->pArray[uVar3]);
              if ((int)uVar3 < p->nSize) {
                if (p->pArray[uVar3] < iVar2) {
                  return;
                }
                fputc(0x29,(FILE *)pFile);
                return;
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Exp_PrintNodeVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Node, int fCompl )
{
    extern void Exp_PrintLitVerilog( FILE * pFile, int nVars, Vec_Int_t * p, Vec_Ptr_t * vNames, int Lit );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+1) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+1) >= 2*nVars )
        fprintf( pFile, ")" );
    fprintf( pFile, " %c ", fCompl ? '|' : '&' );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, "(" );
    Exp_PrintLitVerilog( pFile, nVars, p, vNames, Vec_IntEntry(p, 2*Node+0) ^ fCompl );
    if ( Vec_IntEntry(p, 2*Node+0) >= 2*nVars )
        fprintf( pFile, ")" );
}